

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

CheckedError __thiscall flatbuffers::Parser::TokenError(Parser *this)

{
  Parser *in_RSI;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Parser *this_local;
  
  this_local = this;
  TokenToStringId_abi_cxx11_(&local_58,in_RSI,(in_RSI->super_ParserState).token_);
  std::operator+(&local_38,"cannot parse value starting with: ",&local_58);
  Error(this,(string *)in_RSI);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::TokenError() {
  return Error("cannot parse value starting with: " + TokenToStringId(token_));
}